

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_set.cc
# Opt level: O2

void __thiscall sfm::FeatureSet::compute_sift(FeatureSet *this,ConstPtr *image)

{
  pointer *this_00;
  pointer pDVar1;
  pointer pDVar2;
  pointer pDVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  undefined1 local_e8 [8];
  Sift sift;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  ConstPtr *local_60;
  vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_> *local_58;
  FeatureSet *local_50;
  undefined1 auStack_48 [8];
  Descriptors descr;
  
  auStack_48 = (undefined1  [8])0x0;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  features::Sift::Sift((Sift *)local_e8,&(this->opts).sift_opts);
  this_00 = &sift.descriptors.
             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2> *)this_00,
             &image->
              super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>);
  features::Sift::set_image((Sift *)local_e8,(ConstPtr *)this_00);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  features::Sift::process((Sift *)local_e8);
  std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::operator=
            ((vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             auStack_48,
             (vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_> *)
             &sift.keypoints.
              super__Vector_base<features::Sift::Keypoint,_std::allocator<features::Sift::Keypoint>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_60 = image;
  features::Sift::~Sift((Sift *)local_e8);
  std::
  __sort<__gnu_cxx::__normal_iterator<features::Sift::Descriptor*,std::vector<features::Sift::Descriptor,std::allocator<features::Sift::Descriptor>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(features::Sift::Descriptor_const&,features::Sift::Descriptor_const&)>>
            ((__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
              )auStack_48,
             (__normal_iterator<features::Sift::Descriptor_*,_std::vector<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>_>
              )descr.
               super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (_Iter_comp_iter<bool_(*)(const_features::Sift::Descriptor_&,_const_features::Sift::Descriptor_&)>
              )0x10a47d);
  local_58 = &this->positions;
  lVar4 = (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->positions).
                super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 3;
  std::vector<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>::resize
            (local_58,((long)descr.
                             super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                             ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x210 +
                      lVar4);
  std::vector<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>::
  resize(&this->colors,
         ((long)descr.
                super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x210 + lVar4);
  lVar5 = lVar4 * 3;
  lVar6 = 4;
  uVar7 = 0;
  local_50 = this;
  while( true ) {
    if ((ulong)(((long)descr.
                       super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                       ._M_impl.super__Vector_impl_data._M_start - (long)auStack_48) / 0x210) <=
        uVar7) break;
    *(undefined8 *)
     (local_58->super__Vector_base<math::Vector<float,_2>,_std::allocator<math::Vector<float,_2>_>_>
     )._M_impl.super__Vector_impl_data._M_start[lVar4 + uVar7].v =
         *(undefined8 *)((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v + lVar6 + -0x14)
    ;
    core::Image<unsigned_char>::linear_at
              ((local_60->
               super___shared_ptr<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr,*(float *)((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v +
                                lVar6 + -0x14),
               *(float *)((long)((Vector<float,_128> *)((long)auStack_48 + 0x10))->v + lVar6 + -0x10
                         ),
               ((this->colors).
                super__Vector_base<math::Vector<unsigned_char,_3>,_std::allocator<math::Vector<unsigned_char,_3>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->v + lVar5);
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 0x210;
    lVar5 = lVar5 + 3;
  }
  pDVar1 = (local_50->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pDVar2 = (local_50->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pDVar3 = (local_50->sift_descriptors).
           super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (local_50->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)auStack_48;
  (local_50->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       descr.
       super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (local_50->sift_descriptors).
  super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       descr.
       super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  auStack_48 = (undefined1  [8])pDVar1;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_start = pDVar2;
  descr.super__Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>.
  _M_impl.super__Vector_impl_data._M_finish = pDVar3;
  std::_Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>::
  ~_Vector_base((_Vector_base<features::Sift::Descriptor,_std::allocator<features::Sift::Descriptor>_>
                 *)auStack_48);
  return;
}

Assistant:

void
FeatureSet::compute_sift (core::ByteImage::ConstPtr image)
{
    /* Compute features. */
    Sift::Descriptors descr;
    {
        Sift sift(this->opts.sift_opts);
        sift.set_image(image);
        sift.process();
        descr = sift.get_descriptors();
    }

    /* Sort features by scale for low-res matching. */
    std::sort(descr.begin(), descr.end(), compare_scale<sfm::Sift::Descriptor>);

    /* Prepare and copy to data structures. */
    std::size_t offset = this->positions.size();
    this->positions.resize(offset + descr.size());
    this->colors.resize(offset + descr.size());

    for (std::size_t i = 0; i < descr.size(); ++i)
    {
        Sift::Descriptor const& d = descr[i];
        this->positions[offset + i] = math::Vec2f(d.x, d.y);
        image->linear_at(d.x, d.y, this->colors[offset + i].begin());
    }

    /* Keep SIFT descriptors. */
    std::swap(descr, this->sift_descriptors);
}